

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_config_voice(OpenJTalk *oj,char *path_original)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  uint c;
  char path [260];
  char temp [260];
  char full [260];
  char name_extended [260];
  uint local_46c;
  char local_468 [272];
  char local_358 [272];
  char local_248 [272];
  char local_138 [272];
  
  if (g_verbose) {
    set_config_voice_cold_1();
  }
  memset(local_468,0,0x104);
  strcpy(local_468,path_original);
  if (oj == (OpenJTalk *)0x0) {
    return false;
  }
  if (local_468[0] == '\0') {
    return false;
  }
  memset(local_358,0,0x104);
  _Var1 = is_name_only(local_468);
  if (_Var1) {
    if (g_verbose == true) {
      fprintf(_stderr,anon_var_dwarf_4e2,local_468);
    }
    sVar2 = strlen(local_468);
    pcVar4 = G_VOICE_EXT;
    sVar3 = strlen(G_VOICE_EXT);
    if (0xfffffffffffffefa < (sVar3 + sVar2) - 0x104) {
      strcpy(local_138,local_468);
      strcat(local_138,pcVar4);
      local_46c = 0;
      _Var1 = search_file_recursive(oj->dn_voice_dir_path,local_138,local_358,&local_46c,200);
      if (_Var1) goto LAB_00141ce4;
    }
  }
  else {
    _Var1 = is_relative(local_468);
    if (_Var1) {
      if (g_verbose != false) {
        fprintf(_stderr,anon_var_dwarf_4ed,local_468);
      }
      sVar2 = strlen(g_ini_dir);
      if (sVar2 == 0) {
        return false;
      }
      sVar3 = strlen(local_468);
      if ((sVar3 + sVar2) - 0x103 < 0xfffffffffffffefb) {
        return false;
      }
      strcpy(local_358,g_ini_dir);
      strcat(local_358,G_SLASH_CHAR);
      strcat(local_358,local_468);
    }
    else {
      if (g_verbose != false) {
        fprintf(_stderr,anon_var_dwarf_504,local_468);
      }
      strcpy(local_358,local_468);
    }
    _Var1 = exists_file(local_358);
    if (_Var1) {
LAB_00141ce4:
      memset(local_248,0,0x104);
      pcVar4 = realpath(local_358,local_248);
      if (pcVar4 == (char *)0x0) {
        memset(local_248,0,0x104);
      }
      strcpy(oj->fn_voice_path,local_248);
      Open_JTalk_load_voice(oj->open_jtalk,local_248);
      return true;
    }
    if (g_verbose == true) {
      fprintf(_stderr,anon_var_dwarf_50f,local_358);
      return false;
    }
  }
  return false;
}

Assistant:

bool set_config_voice(OpenJTalk *oj, const char *path_original)
{
	if (g_verbose)
	{
		console_message(u8"設定ファイルの情報から音響モデルファイルを決定\n");
	}

	char path[MAX_PATH];
	clear_path_string(path, MAX_PATH);
#if defined(_WIN32)
	normalize_back_slash(path_original, path);
#else
	strcpy(path, path_original);
#endif

	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_name_only(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルファイルは名前のみの指定です。： %s\n", path);
		}

		if (strlen(path) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
		{
			return false;
		}

		char name_extended[MAX_PATH];
		strcat(strcpy(name_extended, path), G_VOICE_EXT);
		unsigned int c = 0;
		if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
		{
			goto return_true;
		}
		return false;
	}

	if (is_relative(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルファイル指定は相対指定です： %s\n", path);
		}

		if (g_ini_dir == NULL || strlen(g_ini_dir) == 0)
		{
			return false;
		}

		if (strlen(g_ini_dir) + 1 + strlen(path) + 1 > MAX_PATH)
		{
			return false;
		}

		strcpy(temp, g_ini_dir);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, path);
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルファイル指定は相対指定ではありません： %s\n", path);
		}
		strcpy(temp, path);
	}

	if (!exists_file(temp))
	{
		if (g_verbose)
		{
			console_message_string(u8"指定された音響モデルファイルは存在しません： %s\n", temp);
		}
		return false;
	}

	char full[MAX_PATH];
return_true:
	clear_path_string(full, MAX_PATH);
	get_fullpath(temp, full);
	strcpy(oj->fn_voice_path, full);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(full, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, full);
#endif
	return true;
}